

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecmanager.cxx
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
vigra::CodecManager::queryCodecBandNumbers(CodecManager *this,string *filetype)

{
  pointer ppVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>_>
  *in_RSI;
  CodecDesc *in_RDI;
  const_iterator result;
  CodecDesc *pCVar2;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff57;
  _Self local_28;
  _Self local_20 [4];
  
  pCVar2 = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>_>
       ::find(in_RSI,(key_type *)0x1566d9);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>_>
       ::end(in_RSI);
  std::operator!=(local_20,&local_28);
  throw_precondition_error
            ((bool)in_stack_ffffffffffffff57,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (int)((ulong)pCVar2 >> 0x20));
  ppVar1 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>
                         *)0x156736);
  (**ppVar1->second->_vptr_CodecFactory)(&stack0xffffffffffffff40);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI,(vector<int,_std::allocator<int>_> *)in_RSI
            );
  CodecDesc::~CodecDesc(in_RDI);
  return (vector<int,_std::allocator<int>_> *)pCVar2;
}

Assistant:

std::vector<int>
    CodecManager::queryCodecBandNumbers( const std::string & filetype ) const
    {
        std::map< std::string, CodecFactory * >::const_iterator result
            = factoryMap.find( filetype );
        vigra_precondition( result != factoryMap.end(),
        "the codec that was queried for its pixeltype does not exist" );

        return result->second->getCodecDesc().bandNumbers;
    }